

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

void amrex::anon_unknown_12::addDefn
               (string *def,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *val,list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                    *tab)

{
  __type _Var1;
  ostream *poVar2;
  PP_entry local_68;
  
  if (def->_M_string_length != 0) {
    if ((val->
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)val) {
      poVar2 = ErrorStream();
      poVar2 = std::operator<<(poVar2,"ParmParse::addDefn(): no values for definition ");
      poVar2 = std::operator<<(poVar2,(string *)def);
      std::operator<<(poVar2,"\n");
      Abort_host((char *)0x0);
    }
    _Var1 = std::operator==(def,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )ParmParse::FileKeyword_abi_cxx11_);
    if ((_Var1) &&
       ((val->
        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl._M_node._M_size == 1)) {
      read_file((char *)(val->
                        super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl._M_node.super__List_node_base._M_next[1]._M_next,tab);
    }
    else {
      ParmParse::PP_entry::PP_entry(&local_68,def,val);
      std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
      push_back(tab,&local_68);
      ParmParse::PP_entry::~PP_entry(&local_68);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(val);
    local_68.m_name._M_dataplus._M_p = (pointer)&local_68.m_name.field_2;
    local_68.m_name._M_string_length = 0;
    local_68.m_name.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::operator=((string *)def,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    return;
  }
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(val);
  return;
}

Assistant:

void
addDefn (std::string&         def,
         std::list<std::string>&   val,
         std::list<ParmParse::PP_entry>& tab)
{
    //
    // Check that defn exists.
    //
    if ( def.empty() )
    {
        val.clear();
        return;
    }
    //
    // Check that it has values.
    //
    if ( val.empty() )
    {
        amrex::ErrorStream() << "ParmParse::addDefn(): no values for definition " << def << "\n";
        amrex::Abort();
    }
    //
    // Check if this defn is a file include directive.
    //
    if ( def == ParmParse::FileKeyword && val.size() == 1 )
    {
        //
        // Read file and add to this table.
        //
        const char* fname = val.front().c_str();
        read_file(fname, tab);
    }
    else
    {
        tab.push_back(ParmParse::PP_entry(def,val));
    }
    val.clear();
    def = std::string();
}